

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsession.cpp
# Opt level: O1

void __thiscall jrtplib::RTPSession::~RTPSession(RTPSession *this)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  
  (this->super_RTPMemoryObject)._vptr_RTPMemoryObject = (_func_int **)&PTR__RTPSession_00143d28;
  Destroy(this);
  if ((this->deletertprnd == true) && (this->rtprnd != (RTPRandom *)0x0)) {
    (*this->rtprnd->_vptr_RTPRandom[1])();
  }
  p_Var2 = (this->byepackets).
           super__List_base<jrtplib::RTCPCompoundPacket_*,_std::allocator<jrtplib::RTCPCompoundPacket_*>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  while (p_Var2 != (_List_node_base *)&this->byepackets) {
    p_Var1 = p_Var2->_M_next;
    operator_delete(p_Var2,0x18);
    p_Var2 = p_Var1;
  }
  RTPCollisionList::~RTPCollisionList(&this->collisionlist);
  RTCPPacketBuilder::~RTCPPacketBuilder(&this->rtcpbuilder);
  RTCPScheduler::~RTCPScheduler(&this->rtcpsched);
  RTPPacketBuilder::~RTPPacketBuilder(&this->packetbuilder);
  RTPSources::~RTPSources(&(this->sources).super_RTPSources);
  return;
}

Assistant:

RTPSession::~RTPSession()
{
	Destroy();

	if (deletertprnd)
		delete rtprnd;
}